

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

aiMesh * Assimp::MakeSubmesh(aiMesh *pMesh,
                            vector<unsigned_int,_std::allocator<unsigned_int>_> *subMeshFaces,
                            uint subFlags)

{
  aiColor4D *paVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  aiVector3D *paVar6;
  aiBone *paVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  aiMesh *paVar23;
  ulong uVar24;
  aiVector3D *paVar25;
  aiColor4D *paVar26;
  ulong *puVar27;
  uint *puVar28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar29;
  aiBone **__s;
  aiBone *paVar30;
  aiVertexWeight *paVar31;
  aiFace *paVar32;
  ulong uVar33;
  aiFace *paVar34;
  long lVar35;
  uint n;
  long lVar36;
  ulong uVar37;
  size_t a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vMap;
  allocator_type local_a9;
  ulong local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  uint local_94;
  uint local_90;
  value_type_conflict4 local_8c;
  pointer local_88;
  pointer local_80;
  aiColor4D **local_78;
  aiVector3D **local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  long local_38;
  
  local_94 = subFlags;
  paVar23 = (aiMesh *)operator_new(0x520);
  paVar23->mPrimitiveTypes = 0;
  paVar23->mNumVertices = 0;
  uVar37 = 0;
  paVar23->mNumFaces = 0;
  local_70 = &paVar23->mVertices;
  memset(local_70,0,0xcc);
  paVar23->mBones = (aiBone **)0x0;
  paVar23->mMaterialIndex = 0;
  (paVar23->mName).length = 0;
  (paVar23->mName).data[0] = '\0';
  memset((paVar23->mName).data + 1,0x1b,0x3ff);
  paVar23->mNumAnimMeshes = 0;
  paVar23->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar23->mMethod = 0;
  (paVar23->mAABB).mMin.x = 0.0;
  (paVar23->mAABB).mMin.y = 0.0;
  (paVar23->mAABB).mMin.z = 0.0;
  (paVar23->mAABB).mMax.x = 0.0;
  (paVar23->mAABB).mMax.y = 0.0;
  (paVar23->mAABB).mMax.z = 0.0;
  paVar23->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar23->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar23->mNumUVComponents[0] = 0;
  paVar23->mNumUVComponents[1] = 0;
  paVar23->mNumUVComponents[2] = 0;
  paVar23->mNumUVComponents[3] = 0;
  paVar23->mNumUVComponents[4] = 0;
  paVar23->mNumUVComponents[5] = 0;
  paVar23->mNumUVComponents[6] = 0;
  paVar23->mNumUVComponents[7] = 0;
  paVar23->mColors[0] = (aiColor4D *)0x0;
  paVar23->mColors[1] = (aiColor4D *)0x0;
  paVar23->mColors[2] = (aiColor4D *)0x0;
  paVar23->mColors[3] = (aiColor4D *)0x0;
  paVar23->mColors[4] = (aiColor4D *)0x0;
  paVar23->mColors[5] = (aiColor4D *)0x0;
  paVar23->mColors[6] = (aiColor4D *)0x0;
  paVar23->mColors[7] = (aiColor4D *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,(ulong)pMesh->mNumVertices,(value_type_conflict4 *)&local_68,
             (allocator_type *)&local_8c);
  local_80 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
  local_88 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish;
  local_a8 = (long)local_88 - (long)local_80 >> 2;
  local_38 = (long)local_88 - (long)local_80;
  if (local_38 != 0) {
    uVar24 = 0;
    uVar37 = 0;
    do {
      uVar3 = (subMeshFaces->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar24];
      if (pMesh->mFaces[uVar3].mNumIndices != 0) {
        paVar32 = pMesh->mFaces + uVar3;
        uVar33 = 0;
        do {
          uVar3 = paVar32->mIndices[uVar33];
          if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3] == 0xffffffff) {
            local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3] = (uint)uVar37;
            uVar37 = uVar37 + 1;
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 < paVar32->mNumIndices);
      }
      uVar24 = uVar24 + 1;
    } while ((uVar24 & 0xffffffff) < local_a8);
  }
  local_a0 = subMeshFaces;
  if (paVar23 != pMesh) {
    uVar3 = (pMesh->mName).length;
    (paVar23->mName).length = uVar3;
    memcpy((paVar23->mName).data,(pMesh->mName).data,(ulong)uVar3);
    (paVar23->mName).data[uVar3] = '\0';
  }
  paVar23->mMaterialIndex = pMesh->mMaterialIndex;
  paVar23->mPrimitiveTypes = pMesh->mPrimitiveTypes;
  paVar23->mNumFaces =
       (uint)((ulong)((long)(local_a0->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(local_a0->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
  paVar23->mNumVertices = (uint)uVar37;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar37;
  uVar24 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0xc),8) == 0) {
    uVar24 = SUB168(auVar8 * ZEXT816(0xc),0);
  }
  paVar25 = (aiVector3D *)operator_new__(uVar24);
  if (uVar37 != 0) {
    memset(paVar25,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  *local_70 = paVar25;
  uVar3 = pMesh->mNumVertices;
  if (uVar3 != 0 && pMesh->mNormals != (aiVector3D *)0x0) {
    paVar25 = (aiVector3D *)operator_new__(uVar24);
    if (uVar37 != 0) {
      memset(paVar25,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar23->mNormals = paVar25;
  }
  if ((pMesh->mBitangents != (aiVector3D *)0x0 && pMesh->mTangents != (aiVector3D *)0x0) &&
      uVar3 != 0) {
    paVar25 = (aiVector3D *)operator_new__(uVar24);
    if (uVar37 != 0) {
      memset(paVar25,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar23->mTangents = paVar25;
    paVar25 = (aiVector3D *)operator_new__(uVar24);
    if (uVar37 != 0) {
      memset(paVar25,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar23->mBitangents = paVar25;
  }
  local_90 = uVar3;
  if (uVar3 != 0) {
    lVar35 = 0;
    do {
      if (pMesh->mTextureCoords[(uint)lVar35 & 7] == (aiVector3D *)0x0) break;
      paVar25 = (aiVector3D *)operator_new__(uVar24);
      if (uVar37 != 0) {
        memset(paVar25,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar23->mTextureCoords[lVar35] = paVar25;
      paVar23->mNumUVComponents[lVar35] = pMesh->mNumUVComponents[lVar35];
      lVar35 = lVar35 + 1;
    } while (lVar35 != 8);
  }
  local_78 = paVar23->mColors;
  if (local_90 != 0) {
    lVar35 = 0;
    do {
      if (pMesh->mColors[(uint)lVar35 & 7] == (aiColor4D *)0x0) break;
      paVar26 = (aiColor4D *)operator_new__(-(ulong)(uVar37 >> 0x3c != 0) | uVar37 << 4);
      if (uVar37 != 0) {
        memset(paVar26,0,uVar37 << 4);
      }
      local_78[lVar35] = paVar26;
      lVar35 = lVar35 + 1;
    } while (lVar35 != 8);
  }
  puVar27 = (ulong *)operator_new__(local_38 * 4 + 8);
  *puVar27 = local_a8;
  paVar32 = (aiFace *)(puVar27 + 1);
  if (local_88 != local_80) {
    paVar34 = paVar32;
    do {
      paVar34->mNumIndices = 0;
      paVar34->mIndices = (uint *)0x0;
      paVar34 = paVar34 + 1;
    } while (paVar34 != paVar32 + local_a8);
  }
  paVar23->mFaces = paVar32;
  if (local_88 != local_80) {
    uVar37 = 0;
    do {
      paVar32 = pMesh->mFaces;
      uVar3 = (local_a0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar37];
      paVar34 = paVar23->mFaces;
      uVar4 = paVar32[uVar3].mNumIndices;
      paVar34[uVar37].mNumIndices = uVar4;
      puVar28 = (uint *)operator_new__((ulong)uVar4 << 2);
      paVar34 = paVar34 + uVar37;
      paVar34->mIndices = puVar28;
      if (paVar34->mNumIndices != 0) {
        uVar24 = 0;
        do {
          paVar34->mIndices[uVar24] =
               local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[paVar32[uVar3].mIndices[uVar24]];
          uVar24 = uVar24 + 1;
        } while (uVar24 < paVar34->mNumIndices);
      }
      uVar37 = (ulong)((int)uVar37 + 1);
    } while (uVar37 < local_a8);
  }
  if (pMesh->mNumVertices != 0) {
    uVar37 = 0;
    do {
      uVar24 = (ulong)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar37];
      if (uVar24 != 0xffffffff) {
        paVar25 = pMesh->mVertices;
        paVar6 = *local_70;
        paVar6[uVar24].z = paVar25[uVar37].z;
        paVar25 = paVar25 + uVar37;
        fVar5 = paVar25->y;
        paVar6 = paVar6 + uVar24;
        paVar6->x = paVar25->x;
        paVar6->y = fVar5;
        paVar25 = pMesh->mNormals;
        if ((paVar25 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
          paVar6 = paVar23->mNormals;
          paVar6[uVar24].z = paVar25[uVar37].z;
          fVar5 = paVar25[uVar37].y;
          paVar6 = paVar6 + uVar24;
          paVar6->x = paVar25[uVar37].x;
          paVar6->y = fVar5;
        }
        paVar25 = pMesh->mTangents;
        if (((paVar25 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
           (pMesh->mNumVertices != 0)) {
          paVar6 = paVar23->mTangents;
          paVar6[uVar24].z = paVar25[uVar37].z;
          fVar5 = paVar25[uVar37].y;
          paVar6 = paVar6 + uVar24;
          paVar6->x = paVar25[uVar37].x;
          paVar6->y = fVar5;
          paVar25 = pMesh->mBitangents;
          paVar6 = paVar23->mBitangents;
          paVar6[uVar24].z = paVar25[uVar37].z;
          paVar25 = paVar25 + uVar37;
          fVar5 = paVar25->y;
          paVar6 = paVar6 + uVar24;
          paVar6->x = paVar25->x;
          paVar6->y = fVar5;
        }
        lVar35 = 0;
        do {
          if (pMesh->mTextureCoords[lVar35] == (aiVector3D *)0x0) goto LAB_003b976c;
          lVar35 = lVar35 + 1;
        } while (lVar35 != 8);
        lVar35 = 8;
LAB_003b976c:
        if ((int)lVar35 != 0) {
          lVar36 = 0;
          do {
            paVar25 = pMesh->mTextureCoords[lVar36];
            paVar6 = paVar23->mTextureCoords[lVar36];
            paVar6[uVar24].z = paVar25[uVar37].z;
            paVar25 = paVar25 + uVar37;
            fVar5 = paVar25->y;
            paVar6 = paVar6 + uVar24;
            paVar6->x = paVar25->x;
            paVar6->y = fVar5;
            lVar36 = lVar36 + 1;
          } while (lVar35 != lVar36);
        }
        lVar35 = 0;
        do {
          if (pMesh->mColors[lVar35] == (aiColor4D *)0x0) goto LAB_003b97af;
          lVar35 = lVar35 + 1;
        } while (lVar35 != 8);
        lVar35 = 8;
LAB_003b97af:
        if ((int)lVar35 != 0) {
          lVar36 = 0;
          do {
            paVar26 = pMesh->mColors[lVar36] + uVar37;
            fVar5 = paVar26->g;
            fVar9 = paVar26->b;
            fVar10 = paVar26->a;
            paVar1 = local_78[lVar36] + uVar24;
            paVar1->r = paVar26->r;
            paVar1->g = fVar5;
            paVar1->b = fVar9;
            paVar1->a = fVar10;
            lVar36 = lVar36 + 1;
          } while (lVar35 != lVar36);
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < pMesh->mNumVertices);
  }
  if ((local_94 & 1) == 0) {
    local_8c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_68,(ulong)pMesh->mNumBones,&local_8c,&local_a9);
    uVar37 = (ulong)pMesh->mNumBones;
    if (pMesh->mNumBones != 0) {
      uVar24 = 0;
      do {
        paVar7 = pMesh->mBones[uVar24];
        if (paVar7->mNumWeights != 0) {
          uVar37 = 0;
          do {
            if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[paVar7->mWeights[uVar37].mVertexId] != 0xffffffff)
            {
              piVar2 = (int *)(CONCAT44(local_68.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_68.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                              uVar24 * 4);
              *piVar2 = *piVar2 + 1;
            }
            uVar37 = uVar37 + 1;
          } while (uVar37 < paVar7->mNumWeights);
        }
        uVar24 = uVar24 + 1;
        uVar37 = (ulong)pMesh->mNumBones;
      } while (uVar24 < uVar37);
    }
    if ((int)uVar37 != 0) {
      uVar24 = 0;
      do {
        if (*(int *)(CONCAT44(local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar24 * 4) != 0) {
          paVar23->mNumBones = paVar23->mNumBones + 1;
        }
        uVar24 = uVar24 + 1;
      } while (uVar37 != uVar24);
    }
    pvVar29 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)paVar23->mNumBones;
    if (pvVar29 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      local_a0 = pvVar29;
      __s = (aiBone **)operator_new__((long)pvVar29 * 8);
      memset(__s,0,(long)pvVar29 * 8);
      paVar23->mBones = __s;
      paVar23->mNumBones = 0;
      if (pMesh->mNumBones != 0) {
        uVar37 = 0;
        do {
          if (*(int *)(CONCAT44(local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_68.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar37 * 4) != 0)
          {
            paVar30 = (aiBone *)operator_new(0x450);
            (paVar30->mName).length = 0;
            (paVar30->mName).data[0] = '\0';
            memset((paVar30->mName).data + 1,0x1b,0x3ff);
            paVar30->mNumWeights = 0;
            paVar30->mWeights = (aiVertexWeight *)0x0;
            (paVar30->mOffsetMatrix).a1 = 1.0;
            (paVar30->mOffsetMatrix).a2 = 0.0;
            (paVar30->mOffsetMatrix).a3 = 0.0;
            (paVar30->mOffsetMatrix).a4 = 0.0;
            (paVar30->mOffsetMatrix).b1 = 0.0;
            (paVar30->mOffsetMatrix).b2 = 1.0;
            (paVar30->mOffsetMatrix).b3 = 0.0;
            (paVar30->mOffsetMatrix).b4 = 0.0;
            (paVar30->mOffsetMatrix).c1 = 0.0;
            (paVar30->mOffsetMatrix).c2 = 0.0;
            (paVar30->mOffsetMatrix).c3 = 1.0;
            (paVar30->mOffsetMatrix).c4 = 0.0;
            (paVar30->mOffsetMatrix).d1 = 0.0;
            (paVar30->mOffsetMatrix).d2 = 0.0;
            (paVar30->mOffsetMatrix).d3 = 0.0;
            (paVar30->mOffsetMatrix).d4 = 1.0;
            uVar3 = paVar23->mNumBones;
            paVar23->mNumBones = uVar3 + 1;
            paVar23->mBones[uVar3] = paVar30;
            paVar7 = pMesh->mBones[uVar37];
            if (paVar30 != paVar7) {
              uVar3 = (paVar7->mName).length;
              (paVar30->mName).length = uVar3;
              memcpy((paVar30->mName).data,(paVar7->mName).data,(ulong)uVar3);
              (paVar30->mName).data[uVar3] = '\0';
            }
            fVar19 = (paVar7->mOffsetMatrix).a1;
            fVar20 = (paVar7->mOffsetMatrix).a2;
            fVar21 = (paVar7->mOffsetMatrix).a3;
            fVar22 = (paVar7->mOffsetMatrix).a4;
            fVar15 = (paVar7->mOffsetMatrix).b1;
            fVar16 = (paVar7->mOffsetMatrix).b2;
            fVar17 = (paVar7->mOffsetMatrix).b3;
            fVar18 = (paVar7->mOffsetMatrix).b4;
            fVar11 = (paVar7->mOffsetMatrix).c1;
            fVar12 = (paVar7->mOffsetMatrix).c2;
            fVar13 = (paVar7->mOffsetMatrix).c3;
            fVar14 = (paVar7->mOffsetMatrix).c4;
            fVar5 = (paVar7->mOffsetMatrix).d2;
            fVar9 = (paVar7->mOffsetMatrix).d3;
            fVar10 = (paVar7->mOffsetMatrix).d4;
            (paVar30->mOffsetMatrix).d1 = (paVar7->mOffsetMatrix).d1;
            (paVar30->mOffsetMatrix).d2 = fVar5;
            (paVar30->mOffsetMatrix).d3 = fVar9;
            (paVar30->mOffsetMatrix).d4 = fVar10;
            (paVar30->mOffsetMatrix).c1 = fVar11;
            (paVar30->mOffsetMatrix).c2 = fVar12;
            (paVar30->mOffsetMatrix).c3 = fVar13;
            (paVar30->mOffsetMatrix).c4 = fVar14;
            (paVar30->mOffsetMatrix).b1 = fVar15;
            (paVar30->mOffsetMatrix).b2 = fVar16;
            (paVar30->mOffsetMatrix).b3 = fVar17;
            (paVar30->mOffsetMatrix).b4 = fVar18;
            (paVar30->mOffsetMatrix).a1 = fVar19;
            (paVar30->mOffsetMatrix).a2 = fVar20;
            (paVar30->mOffsetMatrix).a3 = fVar21;
            (paVar30->mOffsetMatrix).a4 = fVar22;
            uVar33 = (ulong)*(uint *)(CONCAT44(local_68.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               local_68.
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     uVar37 * 4);
            uVar24 = uVar33 * 8;
            local_a8 = uVar37;
            paVar31 = (aiVertexWeight *)operator_new__(uVar24);
            if (uVar33 != 0) {
              memset(paVar31,0,uVar24);
            }
            paVar30->mWeights = paVar31;
            uVar37 = local_a8;
            if (paVar7->mNumWeights != 0) {
              uVar24 = 0;
              do {
                uVar3 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[paVar7->mWeights[uVar24].mVertexId]
                ;
                if (uVar3 != 0xffffffff) {
                  fVar5 = paVar7->mWeights[uVar24].mWeight;
                  paVar31 = paVar30->mWeights;
                  uVar4 = paVar30->mNumWeights;
                  paVar30->mNumWeights = uVar4 + 1;
                  paVar31[uVar4].mVertexId = uVar3;
                  paVar31[uVar4].mWeight = fVar5;
                }
                uVar24 = uVar24 + 1;
              } while (uVar24 < paVar7->mNumWeights);
            }
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 < pMesh->mNumBones);
      }
      if ((uint)local_a0 != paVar23->mNumBones) {
        __assert_fail("nbParanoia==oMesh->mNumBones",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ProcessHelper.cpp"
                      ,0x1b3,
                      "aiMesh *Assimp::MakeSubmesh(const aiMesh *, const std::vector<unsigned int> &, unsigned int)"
                     );
      }
    }
    if ((void *)CONCAT44(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_68.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_68.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
  }
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return paVar23;
}

Assistant:

aiMesh* MakeSubmesh(const aiMesh *pMesh, const std::vector<unsigned int> &subMeshFaces, unsigned int subFlags)
{
    aiMesh *oMesh = new aiMesh();
    std::vector<unsigned int> vMap(pMesh->mNumVertices,UINT_MAX);

    size_t numSubVerts = 0;
    size_t numSubFaces = subMeshFaces.size();

    for(unsigned int i=0;i<numSubFaces;i++) {
        const aiFace &f = pMesh->mFaces[subMeshFaces[i]];

        for(unsigned int j=0;j<f.mNumIndices;j++)   {
            if(vMap[f.mIndices[j]]==UINT_MAX)   {
                vMap[f.mIndices[j]] = static_cast<unsigned int>(numSubVerts++);
            }
        }
    }

    oMesh->mName = pMesh->mName;

    oMesh->mMaterialIndex = pMesh->mMaterialIndex;
    oMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;

    // create all the arrays for this mesh if the old mesh contained them

    oMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
    oMesh->mNumVertices = static_cast<unsigned int>(numSubVerts);
    oMesh->mVertices = new aiVector3D[numSubVerts];
    if( pMesh->HasNormals() ) {
        oMesh->mNormals = new aiVector3D[numSubVerts];
    }

    if( pMesh->HasTangentsAndBitangents() ) {
        oMesh->mTangents = new aiVector3D[numSubVerts];
        oMesh->mBitangents = new aiVector3D[numSubVerts];
    }

    for( size_t a = 0;  pMesh->HasTextureCoords(static_cast<unsigned int>(a)) ; ++a ) {
        oMesh->mTextureCoords[a] = new aiVector3D[numSubVerts];
        oMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
    }

    for( size_t a = 0; pMesh->HasVertexColors( static_cast<unsigned int>(a)); ++a )    {
        oMesh->mColors[a] = new aiColor4D[numSubVerts];
    }

    // and copy over the data, generating faces with linear indices along the way
    oMesh->mFaces = new aiFace[numSubFaces];

    for(unsigned int a = 0; a < numSubFaces; ++a )  {

        const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
        aiFace& dstFace = oMesh->mFaces[a];
        dstFace.mNumIndices = srcFace.mNumIndices;
        dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

        // accumulate linearly all the vertices of the source face
        for( size_t b = 0; b < dstFace.mNumIndices; ++b )   {
            dstFace.mIndices[b] = vMap[srcFace.mIndices[b]];
        }
    }

    for(unsigned int srcIndex = 0; srcIndex < pMesh->mNumVertices; ++srcIndex ) {
        unsigned int nvi = vMap[srcIndex];
        if(nvi==UINT_MAX) {
            continue;
        }

        oMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
        if( pMesh->HasNormals() ) {
            oMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
        }

        if( pMesh->HasTangentsAndBitangents() ) {
            oMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
            oMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumUVChannels(); c < cc; ++c )    {
                oMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
        }
        for( size_t c = 0, cc = pMesh->GetNumColorChannels(); c < cc; ++c ) {
            oMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
        }
    }

    if(~subFlags&AI_SUBMESH_FLAGS_SANS_BONES)   {
        std::vector<unsigned int> subBones(pMesh->mNumBones,0);

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            const aiBone* bone = pMesh->mBones[a];

            for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                unsigned int v = vMap[bone->mWeights[b].mVertexId];

                if(v!=UINT_MAX) {
                    subBones[a]++;
                }
            }
        }

        for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
            if(subBones[a]>0) {
                oMesh->mNumBones++;
            }
        }

        if(oMesh->mNumBones) {
            oMesh->mBones = new aiBone*[oMesh->mNumBones]();
            unsigned int nbParanoia = oMesh->mNumBones;

            oMesh->mNumBones = 0; //rewind

            for(unsigned int a=0;a<pMesh->mNumBones;++a)    {
                if(subBones[a]==0) {
                    continue;
                }
                aiBone *newBone = new aiBone;
                oMesh->mBones[oMesh->mNumBones++] = newBone;

                const aiBone* bone = pMesh->mBones[a];

                newBone->mName = bone->mName;
                newBone->mOffsetMatrix = bone->mOffsetMatrix;
                newBone->mWeights = new aiVertexWeight[subBones[a]];

                for(unsigned int b=0;b<bone->mNumWeights;b++)   {
                    const unsigned int v = vMap[bone->mWeights[b].mVertexId];

                    if(v!=UINT_MAX) {
                        aiVertexWeight w(v,bone->mWeights[b].mWeight);
                        newBone->mWeights[newBone->mNumWeights++] = w;
                    }
                }
            }

            ai_assert(nbParanoia==oMesh->mNumBones);
            (void)nbParanoia; // remove compiler warning on release build
        }
    }

    return oMesh;
}